

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  bad_alloc *anon_var_0;
  _union_1457 _Stack_d8;
  sigaction sa;
  char *pcStack_30;
  int opt;
  char *vulnerabilityFileName;
  char *footprintFileName;
  char *damagebinFileName;
  char **argv_local;
  int argc_local;
  
  progname = *argv;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          iVar1 = getopt(argc,argv,":d:f:s:vh");
          if (iVar1 == -1) {
            sa.sa_mask.__val[0xe] = 0;
            sa.sa_mask.__val[0xf] = 0;
            sa.sa_mask.__val[0xc] = 0;
            sa.sa_mask.__val[0xd] = 0;
            sa.sa_mask.__val[10] = 0;
            sa.sa_mask.__val[0xb] = 0;
            sa.sa_mask.__val[8] = 0;
            sa.sa_mask.__val[9] = 0;
            sa.sa_mask.__val[6] = 0;
            sa.sa_mask.__val[7] = 0;
            sa.sa_mask.__val[4] = 0;
            sa.sa_mask.__val[5] = 0;
            sa.sa_mask.__val[2] = 0;
            sa.sa_mask.__val[3] = 0;
            sa.sa_mask.__val[0] = 0;
            sa.sa_mask.__val[1] = 0;
            _Stack_d8.sa_handler = (__sighandler_t)0x0;
            sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
            sa.sa_flags = 0;
            sa._140_4_ = 0;
            sigemptyset((sigset_t *)&sa);
            _Stack_d8.sa_handler = segfault_sigaction;
            sa.sa_mask.__val[0xf] = CONCAT44(sa.sa_mask.__val[0xf]._4_4_,4);
            sigaction(0xb,(sigaction *)&_Stack_d8,(sigaction *)0x0);
            crossvalidation::doit(footprintFileName,vulnerabilityFileName,pcStack_30);
            return 0;
          }
          if (iVar1 != 0x3a) break;
          fprintf(_stderr,"option needs a value\n");
        }
        if (iVar1 != 100) break;
        footprintFileName = _optarg;
      }
      if (iVar1 != 0x66) break;
      vulnerabilityFileName = _optarg;
    }
    if (iVar1 == 0x68) break;
    if (iVar1 != 0x73) {
      if (iVar1 == 0x76) {
        fprintf(_stderr,"%s: version: %s\n",*argv,"");
        exit(1);
      }
      break;
    }
    pcStack_30 = _optarg;
  }
  help();
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {

  progname = argv[0];
  char *damagebinFileName;
  char *footprintFileName;
  char *vulnerabilityFileName;
  int opt;
  while((opt = getopt(argc, argv, ":d:f:s:vh")) != -1) {
    switch(opt) {
      case 'd':
	damagebinFileName = optarg;
	break;
      case 'f':
	footprintFileName = optarg;
	break;
      case 's':
	vulnerabilityFileName = optarg;
	break;
      case ':':
	fprintf(stderr, "option needs a value\n");
	break;
      case 'v':
	fprintf(stderr, "%s: version: %s\n", argv[0], VERSION);
	exit(EXIT_FAILURE);
	break;
      case 'h':
      default:
	help();
	exit(EXIT_FAILURE);
    }
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = segfault_sigaction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {
    crossvalidation::doit(damagebinFileName, footprintFileName,
		    	vulnerabilityFileName);
    return 0;
  }
  catch(std::bad_alloc&) {
    fprintf(stderr, "%s: Memory allocation failed.\n", progname);
    exit(0);
  }

}